

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall CompilerContext::compile_continue(CompilerContext *this,SyntaxTree *continue_node)

{
  initializer_list<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  __l;
  bool bVar1;
  pointer pLVar2;
  Command *command;
  unreachable_exception *this_00;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_d0;
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  local_9d [13];
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  *local_90;
  variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
  local_88;
  undefined1 local_50 [40];
  undefined1 local_28 [16];
  reverse_iterator it;
  SyntaxTree *continue_node_local;
  CompilerContext *this_local;
  
  it.current._M_current =
       (__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>
        )(__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>
          )continue_node;
  std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::rbegin
            ((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
             (local_28 + 8));
  while( true ) {
    std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>::rend
              ((vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_> *)
               local_28);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
                             *)(local_28 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
                             *)local_28);
    if (!bVar1) {
      this_00 = (unreachable_exception *)__cxa_allocate_exception(0x10);
      unreachable_exception::unreachable_exception
                (this_00,
                 "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(517)."
                );
      __cxa_throw(this_00,&unreachable_exception::typeinfo,
                  unreachable_exception::~unreachable_exception);
    }
    pLVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
                           *)(local_28 + 8));
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)pLVar2);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
                  *)(local_28 + 8));
  }
  command = std::experimental::optional<const_Command_&>::operator*(&this->commands->goto_);
  local_90 = &local_88;
  pLVar2 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<CompilerContext::LoopInfo_*,_std::vector<CompilerContext::LoopInfo,_std::allocator<CompilerContext::LoopInfo>_>_>_>
                         *)(local_28 + 8));
  eggs::variants::
  variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>::
  variant<std::shared_ptr<Label>&,5ul,std::shared_ptr<Label>>
            ((variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
              *)&local_88,&pLVar2->continue_label);
  local_50._8_8_ = 1;
  local_50._0_8_ =
       (variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>
        *)&local_88;
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::allocator(local_9d);
  __l._M_len = local_50._8_8_;
  __l._M_array = (iterator)local_50._0_8_;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
            *)(local_50 + 0x10),__l,local_9d);
  compile_command(this,command,(ArgList *)(local_50 + 0x10),false);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
             *)(local_50 + 0x10));
  std::
  allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>
  ::~allocator(local_9d);
  local_d0 = (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
              *)local_50;
  do {
    local_d0 = local_d0 + -1;
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(local_d0);
  } while (local_d0 != &local_88);
  return;
}

Assistant:

void CompilerContext::compile_continue(const SyntaxTree& continue_node)
{
    for(auto it = loop_stack.rbegin(); it != loop_stack.rend(); ++it)
    {
        if(it->continue_label)
        {
            compile_command(*commands.goto_, { it->continue_label });
            return;
        }
    }
    Unreachable();
}